

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmFindPackageStack __thiscall cmMakefile::GetFindPackageStack(cmMakefile *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  cmFindPackageStack cVar2;
  cmFindPackageStack cVar3;
  
  (in_RDI->Value).Name._M_dataplus._M_p =
       (pointer)(this->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
  p_Var1 = (this->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (in_RDI->Value).Name._M_string_length = (size_type)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      cVar2.super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      cVar2.super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = in_RDI;
      return (cmFindPackageStack)
             cVar2.super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  cVar3.super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = in_RDX._M_pi;
  cVar3.super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (cmFindPackageStack)
         cVar3.super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

cmFindPackageStack cmMakefile::GetFindPackageStack() const
{
  return this->FindPackageStack;
}